

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O3

void gain_condition(CHAR_DATA *ch,int iCond,int value)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  PC_DATA *pPVar4;
  ushort uVar5;
  int iVar6;
  char *dnoun;
  
  if (value == 0) {
    return;
  }
  bVar1 = is_npc(ch);
  if (bVar1) {
    return;
  }
  bVar1 = is_immortal(ch);
  if (bVar1) {
    return;
  }
  bVar1 = is_heroimm(ch);
  if (bVar1) {
    return;
  }
  if ((ch->act[0] & 0x8000) != 0) {
    return;
  }
  if (ch->desc == (DESCRIPTOR_DATA *)0x0) {
    return;
  }
  pPVar4 = ch->pcdata;
  sVar2 = pPVar4->condition[iCond];
  if (sVar2 == -1) {
    return;
  }
  iVar6 = value + sVar2;
  iVar3 = 0;
  if (0 < iVar6) {
    iVar3 = iVar6;
  }
  pPVar4->condition[iCond] = (short)iVar3;
  if (ch->level < 0xb) {
    if ((iCond == 0) && (sVar2 != 0)) {
      pPVar4->condition[0] = pPVar4->condition[0] + -1;
    }
    else {
      pPVar4->condition[2] = 0;
      pPVar4->condition[3] = 0;
    }
    goto LAB_002c0645;
  }
  iVar3 = number_percent();
  pPVar4 = ch->pcdata;
  sVar2 = pPVar4->condition[iCond];
  if (iVar3 < 0x33) {
    if ((iCond != 2) || (sVar2 != 0)) goto LAB_002c0645;
    bVar1 = is_affected(ch,(int)gsn_accumulate_heat);
    pPVar4 = ch->pcdata;
    if (!bVar1) goto LAB_002c0645;
  }
  else {
    if ((iCond == 3) && (sVar2 == 0)) {
      pPVar4->condition[3] = pPVar4->condition[3] + 1;
      goto LAB_002c0645;
    }
    if ((iCond != 2) || (sVar2 != 0)) goto LAB_002c0645;
    bVar1 = is_affected(ch,(int)gsn_cooling_mist);
    pPVar4 = ch->pcdata;
    if (bVar1) goto LAB_002c0645;
  }
  pPVar4->condition[2] = pPVar4->condition[2] + 1;
LAB_002c0645:
  sVar2 = (short)*(undefined4 *)(pPVar4->condition + 2);
  if (0x4a < sVar2) {
    sVar2 = 0x4b;
  }
  pPVar4->condition[2] = sVar2;
  sVar2 = 0x4b;
  if (pPVar4->condition[3] < 0x4b) {
    sVar2 = pPVar4->condition[3];
  }
  pPVar4->condition[3] = sVar2;
  bVar1 = is_affected(ch,(int)gsn_aura_of_sustenance);
  if (bVar1) {
    pPVar4 = ch->pcdata;
    pPVar4->condition[2] = 0;
    pPVar4->condition[3] = 0;
  }
  if (iCond == 0) {
    if (ch->pcdata->condition[0] != 10) {
      return;
    }
    send_to_char("You are sober.\n\r",ch);
    return;
  }
  if (iCond == 2) {
    if (ch->pcdata->condition[2] < 0x33) {
      return;
    }
    send_to_char("You are thirsty.\n\r",ch);
    sVar2 = ch->pcdata->condition[2];
    if (sVar2 < 0x38) {
      return;
    }
    send_to_char("You are dying of thirst!\n\r",ch);
    if (ch->level < 0xb) {
      return;
    }
    uVar5 = sVar2 - 0x32;
    iVar3 = number_range((uint)uVar5,(uint)uVar5 + (uint)uVar5);
    if (0x13 < iVar3) {
      iVar3 = 0x14;
    }
    iVar6 = 0x14;
    dnoun = "thirst";
  }
  else {
    if (iCond != 3) {
      return;
    }
    if (ch->pcdata->condition[3] < 0x33) {
      return;
    }
    send_to_char("You are hungry.\n\r",ch);
    sVar2 = ch->pcdata->condition[3];
    if (sVar2 < 0x38) {
      return;
    }
    send_to_char("You are starving!\n\r",ch);
    if (ch->level < 0xb) {
      return;
    }
    uVar5 = sVar2 - 0x32;
    iVar6 = number_range((uint)uVar5,(uint)uVar5 + (uint)uVar5);
    iVar3 = 0x14;
    if (iVar6 < 0x14) {
      iVar3 = iVar6;
    }
    iVar6 = 0x10;
    dnoun = "hunger";
  }
  damage_new(ch,ch,iVar3,-1,iVar6,true,false,0,1,dnoun);
  return;
}

Assistant:

void gain_condition(CHAR_DATA *ch, int iCond, int value)
{
	int condition;
	int counter;

	if (value == 0 || is_npc(ch) || is_immortal(ch) || is_heroimm(ch) || IS_SET(ch->act, PLR_NOVOID))
		return;

	if (!ch->desc)
		return;

	condition = ch->pcdata->condition[iCond];

	if (condition == -1)
		return;

	ch->pcdata->condition[iCond] = std::max(0, condition + value);

	if (ch->level > 10)
	{
		if (number_percent() > 50)
		{
			if (ch->pcdata->condition[iCond] == 0 && iCond == COND_HUNGER)
				ch->pcdata->condition[COND_HUNGER]++;

			if (ch->pcdata->condition[iCond] == 0 && iCond == COND_THIRST && !is_affected(ch, gsn_cooling_mist))
				ch->pcdata->condition[COND_THIRST]++;
		}
		else if (ch->pcdata->condition[iCond] == 0 && iCond == COND_THIRST && is_affected(ch, gsn_accumulate_heat))
		{
			ch->pcdata->condition[COND_THIRST]++;
		}
	}
	else if (iCond == COND_DRUNK && condition)
	{
		ch->pcdata->condition[COND_DRUNK]--;
	}
	else
	{
		ch->pcdata->condition[COND_THIRST] = 0;
		ch->pcdata->condition[COND_HUNGER] = 0;
	}

	ch->pcdata->condition[COND_THIRST] = std::min((int)ch->pcdata->condition[COND_THIRST], 75);
	ch->pcdata->condition[COND_HUNGER] = std::min((int)ch->pcdata->condition[COND_HUNGER], 75);

	if (is_affected(ch, gsn_aura_of_sustenance))
	{
		ch->pcdata->condition[COND_HUNGER] = 0;
		ch->pcdata->condition[COND_THIRST] = 0;
	}

	switch (iCond)
	{
		case COND_HUNGER:
			if (ch->pcdata->condition[COND_HUNGER] > COND_HUNGRY)
				send_to_char("You are hungry.\n\r", ch);

			break;
		case COND_THIRST:
			if (ch->pcdata->condition[COND_THIRST] > COND_HUNGRY)
				send_to_char("You are thirsty.\n\r", ch);

			break;
		case COND_DRUNK:
			if (ch->pcdata->condition[COND_DRUNK] == 10)
				send_to_char("You are sober.\n\r", ch);

			break;
		default:
			break;
	}

	if (ch->pcdata->condition[COND_HUNGER] > COND_HUNGRY + 5 && iCond == COND_HUNGER)
	{
		counter = ch->pcdata->condition[COND_HUNGER] - COND_HUNGRY;
		send_to_char("You are starving!\n\r", ch);

		if (ch->level > 10)
			damage_new(ch, ch, std::min(20, number_range(counter, 2 * counter)), TYPE_UNDEFINED, DAM_OTHER, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "hunger");
	}

	if (ch->pcdata->condition[COND_THIRST] > COND_HUNGRY + 5 && iCond == COND_THIRST)
	{
		counter = ch->pcdata->condition[COND_THIRST] - COND_HUNGRY;
		send_to_char("You are dying of thirst!\n\r", ch);

		if (ch->level > 10)
			damage_new(ch, ch, std::min(20, number_range(counter, 2 * counter)), TYPE_UNDEFINED, DAM_INTERNAL, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "thirst");
	}
}